

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-test.cc
# Opt level: O2

void __thiscall
OptionTest_InvalidOption_Test::OptionTest_InvalidOption_Test(OptionTest_InvalidOption_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014c9a8;
  return;
}

Assistant:

TEST(OptionTest, InvalidOption) {
  mp::OptionList options;
  testing::StrictMock<MockHandler> handler;
  mp::OptionList::Builder<MockHandler> builder(options, handler);
  builder.Add<&MockHandler::OnOption1>('a', "test option 1");
  char arg0[] = "-bad";
  char *args[] = {arg0, 0}, **argp = args;
  EXPECT_THROW_MSG(ParseOptions(argp, options), mp::OptionError,
                   "invalid option '-bad'");
}